

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O2

EStatusCode __thiscall
CharStringType1Interpreter::InterpretNumber
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 in_register_00000031;
  Byte byte4;
  Byte byte3;
  Byte byte2;
  Byte byte1_2;
  Byte byte1_1;
  Byte byte1;
  long operand;
  
  if ((byte)(inBuffer - 0x20) < 0xd7) {
    operand = (CONCAT71(in_register_00000031,inBuffer) & 0xffffffff) - 0x8b;
  }
  else if ((byte)(inBuffer + 9) < 4) {
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte1,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      return eFailure;
    }
    operand = (long)(((uint)byte1 + (int)CONCAT71(in_register_00000031,inBuffer) * 0x100) - 0xf694);
  }
  else if ((byte)(inBuffer + 5) < 4) {
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte1_1,1);
    if (CONCAT44(extraout_var_00,iVar1) != 1) {
      return eFailure;
    }
    operand = -0x6c - ((ulong)byte1_1 | (ulong)((uint)inBuffer * 0x100 + 0xff0500 & 0xffff00));
  }
  else {
    if (inBuffer != 0xff) {
      return eFailure;
    }
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte1_2,1);
    if (CONCAT44(extraout_var_01,iVar1) != 1) {
      return eFailure;
    }
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte2,1);
    if (CONCAT44(extraout_var_02,iVar1) != 1) {
      return eFailure;
    }
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte3,1);
    if (CONCAT44(extraout_var_03,iVar1) != 1) {
      return eFailure;
    }
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&byte4,1);
    if (CONCAT44(extraout_var_04,iVar1) != 1) {
      return eFailure;
    }
    operand = (ulong)byte4 |
              (ulong)byte3 << 8 | (long)(int)((uint)byte1_2 << 0x18) | (ulong)byte2 << 0x10;
  }
  std::__cxx11::list<long,_std::allocator<long>_>::push_back(&this->mOperandStack,&operand);
  EVar2 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x1a])
                    (this->mImplementationHelper,operand);
  return EVar2;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretNumber(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret)
{
	long operand;

	if(32 <= inBuffer && inBuffer <= 246)
	{
		operand = (short)inBuffer - 139;
	}
	else if(247 <= inBuffer && inBuffer <= 250)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = (inBuffer - 247) * 256 + byte1 + 108;
	}
	else if(251 <= inBuffer && inBuffer <= 254)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = -(short)(inBuffer - 251) * 256 - byte1 - 108;
	}
	else if(255 == inBuffer)
	{
		Byte byte1,byte2,byte3,byte4;
		
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte2,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte3,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte4,1) != 1)
			return eFailure;


		operand = (int)(
						((unsigned long)(byte1) << 24) + 
						((unsigned long)(byte2) << 16) + 
						((unsigned long)(byte3) << 8) + 
						(byte4));
	}
	else
		return eFailure;

	mOperandStack.push_back(operand);
	return mImplementationHelper->Type1InterpretNumber(operand);
}